

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O0

size_t __thiscall image_hash::operator()(image_hash *this,Image *img)

{
  const_iterator this_00;
  reference pCVar1;
  size_t sVar2;
  char *end;
  char *beg;
  vector<Color,_std::allocator<Color>_> *in_stack_ffffffffffffffb8;
  string_view *in_stack_ffffffffffffffc8;
  __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_> local_20;
  reference local_18;
  
  local_20._M_current =
       (Color *)std::vector<Color,_std::allocator<Color>_>::begin(in_stack_ffffffffffffffb8);
  local_18 = __gnu_cxx::
             __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
             operator*(&local_20);
  this_00 = std::vector<Color,_std::allocator<Color>_>::end(in_stack_ffffffffffffffb8);
  pCVar1 = __gnu_cxx::__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
           ::operator*((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                        *)&stack0xffffffffffffffd0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb8,
             (char *)local_18,(long)pCVar1 - (long)local_18);
  sVar2 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     this_00._M_current,in_stack_ffffffffffffffc8);
  return sVar2;
}

Assistant:

std::size_t operator()(const Image& img) const {
		const char* beg = reinterpret_cast<const char*>(&*img.colorData.begin());
		const char* end = reinterpret_cast<const char*>(&*img.colorData.end());
#if __cplusplus >= 201703L
		return std::hash<std::string_view>()(std::string_view(beg, end - beg));
#else
		return std::hash<std::string>()(std::string(beg, end));
#endif
	}